

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRST.cxx
# Opt level: O2

void reportLine(ostream *os,bool ret,string *line,bool eol)

{
  ostream *poVar1;
  undefined7 in_register_00000031;
  char *pcVar2;
  
  if ((int)os != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"\"");
    poVar1 = std::operator<<(poVar1,(string *)CONCAT71(in_register_00000031,ret));
    poVar1 = std::operator<<(poVar1,"\" (");
    pcVar2 = "without EOL";
    if ((char)line != '\0') {
      pcVar2 = "with EOL";
    }
    poVar1 = std::operator<<(poVar1,pcVar2);
    std::operator<<(poVar1,")");
    return;
  }
  std::operator<<((ostream *)&std::cerr,"EOF");
  return;
}

Assistant:

static void reportLine(std::ostream& os, bool ret, std::string const& line,
                       bool eol)
{
  if (ret) {
    os << "\"" << line << "\" (" << (eol ? "with EOL" : "without EOL") << ")";
  } else {
    os << "EOF";
  }
}